

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall
wasm::OptimizeInstructions::visitRefIsNull(OptimizeInstructions *this,RefIsNull *curr)

{
  bool bVar1;
  Module *wasm;
  Drop *left;
  Const *right;
  Block *rep;
  optional<wasm::Type> type;
  Type local_78 [2];
  undefined1 local_68 [2] [12];
  Type local_48;
  Literal local_40;
  Builder local_28;
  Builder builder;
  RefIsNull *curr_local;
  OptimizeInstructions *this_local;
  
  builder.wasm._4_4_ = 1;
  bVar1 = wasm::Type::operator==
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)42>).super_Expression.
                      type,(BasicType *)((long)&builder.wasm + 4));
  if (!bVar1) {
    wasm = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
           getModule(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                      ).
                      super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      .
                      super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                    );
    Builder::Builder(&local_28,wasm);
    bVar1 = wasm::Type::isNonNullable(&curr->value->type);
    if (bVar1) {
      left = Builder::makeDrop(&local_28,curr->value);
      wasm::Type::Type(&local_48,i32);
      wasm::Literal::makeZero(&local_40,local_48);
      right = Builder::makeConst(&local_28,&local_40);
      std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_68);
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._12_4_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           (_Storage<wasm::Type,_true>)local_68[0]._0_8_;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_68[0][8];
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_3_ = local_68[0]._9_3_;
      rep = Builder::makeSequence(&local_28,(Expression *)left,(Expression *)right,type);
      replaceCurrent(this,(Expression *)rep);
      wasm::Literal::~Literal(&local_40);
    }
    else {
      wasm::Type::Type(local_78,none);
      skipCast(this,&curr->value,local_78[0]);
    }
  }
  return;
}

Assistant:

void visitRefIsNull(RefIsNull* curr) {
    if (curr->type == Type::unreachable) {
      return;
    }

    // Optimizing RefIsNull is not that obvious, since even if we know the
    // result evaluates to 0 or 1 then the replacement may not actually save
    // code size, since RefIsNull is a single byte while adding a Const of 0
    // would be two bytes. Other factors are that we can remove the input and
    // the added drop on it if it has no side effects, and that replacing with a
    // constant may allow further optimizations later. For now, replace with a
    // constant, but this warrants more investigation. TODO

    Builder builder(*getModule());
    if (curr->value->type.isNonNullable()) {
      replaceCurrent(
        builder.makeSequence(builder.makeDrop(curr->value),
                             builder.makeConst(Literal::makeZero(Type::i32))));
    } else {
      skipCast(curr->value);
    }
  }